

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::FilterTemplateToken::~FilterTemplateToken(FilterTemplateToken *this)

{
  (this->super_TemplateToken)._vptr_TemplateToken = (_func_int **)&PTR__FilterTemplateToken_00257390
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->filter).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  TemplateToken::~TemplateToken(&this->super_TemplateToken);
  return;
}

Assistant:

FilterTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, std::shared_ptr<Expression> && filter)
      : TemplateToken(Type::Filter, loc, pre, post), filter(std::move(filter)) {}